

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O3

bool __thiscall Omega_h::StateRowLess::operator()(StateRowLess *this,int *a,int *b)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  int iVar4;
  ConstRef pvVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  
  iVar1 = *a;
  if ((long)iVar1 < 0) {
LAB_002c4351:
    pcVar9 = "0 <= i";
    uVar6 = 0x1d;
  }
  else {
    piVar3 = (this->accepted->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (uint)((ulong)((long)(this->accepted->super__Vector_base<int,_std::allocator<int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
    if (iVar1 < (int)uVar7) {
      uVar8 = *b;
      if ((long)(int)uVar8 < 0) goto LAB_002c4351;
      if (uVar8 < uVar7) {
        iVar2 = piVar3[(int)uVar8];
        iVar1 = piVar3[iVar1];
        bVar10 = SBORROW4(iVar1,iVar2);
        iVar4 = iVar1 - iVar2;
        if (iVar1 == iVar2) {
          uVar7 = this->table->ncols;
          uVar8 = 0;
          if (0 < (int)uVar7) {
            do {
              pvVar5 = at<int>(this->table,*a,uVar8);
              iVar2 = *pvVar5;
              pvVar5 = at<int>(this->table,*b,uVar8);
              iVar1 = *pvVar5;
              bVar10 = SBORROW4(iVar2,iVar1);
              iVar4 = iVar2 - iVar1;
              if (iVar2 != iVar1) goto LAB_002c433c;
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar8);
            uVar8 = 0;
          }
        }
        else {
LAB_002c433c:
          uVar8 = (uint)(bVar10 != iVar4 < 0);
        }
        return SUB41(uVar8,0);
      }
    }
    pcVar9 = "i < int(v.size())";
    uVar6 = 0x1e;
  }
  fail("assertion %s failed at %s +%d\n",pcVar9,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
       ,uVar6);
}

Assistant:

bool operator()(int const& a, int const& b) const {
    auto aa = at(accepted, a);
    auto ab = at(accepted, b);
    if (aa != ab) return aa < ab;
    for (int symbol = 0, ncols = get_ncols(table); symbol < ncols; ++symbol) {
      auto ea = at(table, a, symbol);
      auto eb = at(table, b, symbol);
      if (ea != eb) return ea < eb;
    }
    return false;
  }